

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FieldGenerator::SetHasBitIndex
          (FieldGenerator *this,int32_t has_bit_index)

{
  bool bVar1;
  mapped_type *pmVar2;
  LogMessage *other;
  ulong uVar3;
  Hex hex;
  Hex hex_00;
  AlphaNum *in_stack_fffffffffffffe88;
  allocator local_16d;
  int local_16c;
  key_type local_168;
  string local_148;
  char *local_128;
  char *local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar1 = HasHasbit(this->descriptor_);
  if (bVar1) {
    local_128 = "_has_bits_[";
    local_120 = (char *)0xb;
    local_16c = has_bit_index / 0x20;
    strings::AlphaNum::AlphaNum(&local_f0,local_16c);
    local_60.piece_data_ = "] |= 0x";
    local_60.piece_size_ = 7;
    uVar3 = (ulong)(uint)(1 << ((byte)has_bit_index & 0x1f));
    hex._8_8_ = 8;
    hex.value = uVar3;
    strings::AlphaNum::AlphaNum(&local_90,hex);
    local_c0.piece_data_ = "u;";
    local_c0.piece_size_ = 2;
    StrCat_abi_cxx11_(&local_148,(protobuf *)&local_128,&local_f0,&local_60,&local_90,&local_c0,
                      in_stack_fffffffffffffe88);
    std::__cxx11::string::string((string *)&local_168,"set_hasbit",&local_16d);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_168);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    local_128 = "_has_bits_[";
    local_120 = (char *)0xb;
    strings::AlphaNum::AlphaNum(&local_f0,local_16c);
    local_60.piece_data_ = "] &= ~0x";
    local_60.piece_size_ = 8;
    hex_00._8_8_ = 8;
    hex_00.value = uVar3;
    strings::AlphaNum::AlphaNum(&local_90,hex_00);
    local_c0.piece_data_ = "u;";
    local_c0.piece_size_ = 2;
    StrCat_abi_cxx11_(&local_148,(protobuf *)&local_128,&local_f0,&local_60,&local_90,&local_c0,
                      in_stack_fffffffffffffe88);
    std::__cxx11::string::string((string *)&local_168,"clear_hasbit",&local_16d);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_168);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
  }
  else if (has_bit_index != -1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_field.cc"
               ,0x112);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&local_128,"CHECK failed: (has_bit_index) == (-1): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_f0,other);
    internal::LogMessage::~LogMessage((LogMessage *)&local_128);
  }
  return;
}

Assistant:

void FieldGenerator::SetHasBitIndex(int32_t has_bit_index) {
  if (!HasHasbit(descriptor_)) {
    GOOGLE_CHECK_EQ(has_bit_index, -1);
    return;
  }
  variables_["set_hasbit"] = StrCat(
      "_has_bits_[", has_bit_index / 32, "] |= 0x",
      strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8), "u;");
  variables_["clear_hasbit"] = StrCat(
      "_has_bits_[", has_bit_index / 32, "] &= ~0x",
      strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8), "u;");
}